

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void uncounting_illegal_callback_fn(char *str,void *data)

{
  int *in_RSI;
  int32_t *p;
  
  if (*in_RSI == -0x80000000) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x58,"test condition failed: *p != INT32_MIN");
    abort();
  }
  *in_RSI = *in_RSI + -1;
  return;
}

Assistant:

static void uncounting_illegal_callback_fn(const char* str, void* data) {
    /* Dummy callback function that just counts (backwards). */
    int32_t *p;
    (void)str;
    p = data;
    CHECK(*p != INT32_MIN);
    (*p)--;
}